

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SimdBool16x8<Js::OpLayoutT_Bool16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Bool16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  int iVar1;
  SIMDValue bValue;
  AsmJsSIMDValue result;
  bool values [8];
  OpLayoutT_Bool16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  iVar1 = GetRegRawInt<unsigned_char>(this,playout->I1);
  result.field_0.i8[8] = iVar1 != 0;
  iVar1 = GetRegRawInt<unsigned_char>(this,playout->I2);
  result.field_0.i8[9] = iVar1 != 0;
  iVar1 = GetRegRawInt<unsigned_char>(this,playout->I3);
  result.field_0.i8[10] = iVar1 != 0;
  iVar1 = GetRegRawInt<unsigned_char>(this,playout->I4);
  result.field_0.i8[0xb] = iVar1 != 0;
  iVar1 = GetRegRawInt<unsigned_char>(this,playout->I5);
  result.field_0.i8[0xc] = iVar1 != 0;
  iVar1 = GetRegRawInt<unsigned_char>(this,playout->I6);
  result.field_0.i8[0xd] = iVar1 != 0;
  iVar1 = GetRegRawInt<unsigned_char>(this,playout->I7);
  result.field_0.i8[0xe] = iVar1 != 0;
  iVar1 = GetRegRawInt<unsigned_char>(this,playout->I8);
  result.field_0.u8[0xf] = -(iVar1 != 0) & 1;
  bValue = SIMDBool16x8Operation::OpBool16x8((bool *)(result.field_0.i8 + 8));
  SetRegRawSimd<unsigned_char>(this,playout->B8_0,(AsmJsSIMDValue)bValue.field_0);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SimdBool16x8(const unaligned T* playout)
    {
        bool values[8];
        values[0] = GetRegRawInt(playout->I1) ? true : false;
        values[1] = GetRegRawInt(playout->I2) ? true : false;
        values[2] = GetRegRawInt(playout->I3) ? true : false;
        values[3] = GetRegRawInt(playout->I4) ? true : false;
        values[4] = GetRegRawInt(playout->I5) ? true : false;
        values[5] = GetRegRawInt(playout->I6) ? true : false;
        values[6] = GetRegRawInt(playout->I7) ? true : false;
        values[7] = GetRegRawInt(playout->I8) ? true : false;

        AsmJsSIMDValue result = SIMDBool16x8Operation::OpBool16x8(values);
        SetRegRawSimd(playout->B8_0, result);
    }